

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_time.c
# Opt level: O0

long date_to_julian(int y,int m,int d)

{
  int d_local;
  int m_local;
  int y_local;
  
  return (long)(((((y + 0x12c0 + (m + -0xe) / 0xc) * 0x5b5) / 4 +
                 ((m + -2 + ((m + -0xe) / 0xc) * -0xc) * 0x16f) / 0xc) -
                (((y + 0x1324 + (m + -0xe) / 0xc) / 100) * 3) / 4) + d + -0x7d4b);
}

Assistant:

static long date_to_julian(int y, int m, int d)
{
    return (1461 * (y + 4800 + (m - 14) / 12)) / 4 +
        (367 * (m - 2 - 12 * ((m - 14) / 12))) / 12 -
        (3 * ((y + 4900 + (m - 14) / 12) / 100)) / 4 + d - 32075;
}